

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

int vfio_enable_msix(int device_fd,uint32_t interrupt_vector)

{
  __off_t __offset;
  long lVar1;
  ulong uVar2;
  code *pcVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  code *pcVar9;
  ssize_t sVar10;
  size_t sVar11;
  char *pcVar12;
  void *pvVar13;
  int __timeout;
  epoll_event *__events;
  undefined4 uVar14;
  ulong uVar15;
  char *__buf;
  undefined1 *puVar16;
  undefined1 *puVar17;
  epoll_event *peVar18;
  ulong unaff_R12;
  long lVar19;
  ulong *puVar20;
  code *unaff_R15;
  char irq_set_buf [152];
  char buf [512];
  undefined8 auStack_30e0 [2];
  size_t asStack_30d0 [67];
  long lStack_2eb8;
  int iStack_2eb0;
  uint uStack_2eac;
  undefined8 uStack_2ea8;
  undefined1 auStack_2ea0 [512];
  stat sStack_2ca0;
  char acStack_2c10 [4096];
  char acStack_1c10 [4096];
  ulong auStack_c10 [3];
  epoll_event aeStack_bf4 [33];
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  epoll_event aeStack_9d0 [32];
  undefined1 auStack_7d0 [8];
  ulong uStack_7c8;
  ulong uStack_7c0;
  code *pcStack_7a0;
  ulong uStack_798;
  int iStack_790;
  undefined4 uStack_78c;
  undefined1 auStack_788 [512];
  ulong uStack_588;
  undefined1 auStack_4c0 [512];
  code *pcStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint32_t local_2a8;
  int local_2a4;
  undefined1 local_218 [512];
  
  pcStack_2c0 = (code *)0x101cba;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x60,
          "vfio_enable_msix");
  pcStack_2c0 = (code *)0x101cc3;
  iVar4 = eventfd(0,0);
  uVar5 = 0x21;
  if (interrupt_vector < 0x21) {
    uVar5 = interrupt_vector;
  }
  local_2a8 = 1;
  if (interrupt_vector != 0) {
    local_2a8 = uVar5;
  }
  local_2b8 = 0x2400000098;
  uStack_2b0 = 2;
  pcStack_2c0 = (code *)0x101d00;
  local_2a4 = iVar4;
  iVar6 = ioctl(device_fd,0x3b6e);
  if (iVar6 != -1) {
    return iVar4;
  }
  puVar16 = local_218;
  pcStack_2c0 = vfio_disable_msix;
  vfio_enable_msix_cold_1();
  pcStack_2c0 = (code *)(ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar4 = ioctl((int)puVar16,0x3b6e);
  if (iVar4 != -1) {
    return 0;
  }
  puVar17 = auStack_4c0;
  vfio_disable_msix_cold_1();
  puVar20 = &uStack_798;
  pcStack_7a0 = (code *)0x101dd2;
  uStack_588 = (ulong)puVar16 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar3 = (code *)0x2;
  while( true ) {
    pcVar9 = pcVar3;
    uStack_798 = 0x10;
    iVar6 = (int)pcVar9;
    uStack_78c = 0;
    uVar15 = 0x3b6d;
    pcStack_7a0 = (code *)0x101dff;
    iStack_790 = iVar6;
    iVar4 = ioctl((int)puVar17,0x3b6d,&uStack_798);
    uVar2 = uStack_798;
    if (iVar4 == -1) break;
    unaff_R12 = uStack_798 >> 0x20;
    if ((uStack_798 & 0x100000000) == 0) {
      pcStack_7a0 = (code *)0x101e26;
      vfio_setup_interrupt_cold_1();
      pcVar9 = (code *)((ulong)unaff_R15 & 0xffffffff);
    }
    if ((uVar2 & 0x100000000) != 0) {
      return (int)pcVar9;
    }
    pcVar3 = (code *)(ulong)(iVar6 - 1);
    unaff_R15 = pcVar9;
    if (iVar6 == 0) {
      return -1;
    }
  }
  iVar4 = (int)auStack_788;
  pcStack_7a0 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_2();
  lVar1 = -((uVar15 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_9d0 + lVar1);
  uStack_7c8 = (ulong)puVar17 & 0xffffffff;
  uStack_7c0 = unaff_R12;
  pcStack_7a0 = pcVar9;
  *(undefined8 *)((long)&uStack_9d8 + lVar1) = 0x101e85;
  uVar7 = epoll_wait(iVar4,__events,(int)uVar15,__timeout);
  if (uVar7 != 0xffffffff) {
    puVar20 = (ulong *)(ulong)uVar7;
    if (0 < (int)uVar7) {
      lVar19 = 0;
      do {
        iVar4 = *(int *)((long)aeStack_9d0 + lVar19 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_9d8 + lVar1) = 0x101eb5;
        sVar10 = read(iVar4,auStack_7d0,8);
        if (sVar10 == -1) {
          *(undefined8 *)((long)&uStack_9d8 + lVar1) = 0x101ee2;
          vfio_epoll_wait_cold_1();
          goto LAB_00101ee2;
        }
        lVar19 = lVar19 + 0xc;
      } while ((long)puVar20 * 0xc != lVar19);
    }
    return uVar7;
  }
LAB_00101ee2:
  peVar18 = aeStack_9d0;
  *(code **)((long)&uStack_9d8 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_9d8 + lVar1) = &pcStack_7a0;
  *(epoll_event **)((long)&uStack_9e0 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_bf4 + lVar1) = 1;
  *(int *)((long)aeStack_bf4 + lVar1 + 4) = (int)peVar18;
  *(undefined8 *)((long)auStack_c10 + lVar1 + 0x10) = 0x101f0c;
  uVar7 = epoll_create1(0);
  if (uVar7 == 0xffffffff) {
    *(undefined8 *)((long)auStack_c10 + lVar1 + 0x10) = 0x101f41;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar7;
    *(undefined8 *)((long)auStack_c10 + lVar1 + 0x10) = 0x101f26;
    iVar4 = epoll_ctl(uVar7,1,(int)peVar18,(epoll_event *)((long)aeStack_bf4 + lVar1));
    if (iVar4 != -1) {
      return uVar7;
    }
  }
  lVar19 = (long)aeStack_bf4 + lVar1 + 0xc;
  *(code **)((long)auStack_c10 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_c10 + lVar1 + 0x10) = (ulong)peVar18 & 0xffffffff;
  *(ulong **)((long)auStack_c10 + lVar1 + 8) = puVar20;
  *(epoll_event **)((long)auStack_c10 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x101f7a;
  snprintf(acStack_1c10 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar19);
  *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x101f8a;
  iVar4 = stat(acStack_1c10 + lVar1,(stat *)((long)&sStack_2ca0 + lVar1));
  if (iVar4 < 0) {
    return -1;
  }
  pcVar12 = acStack_1c10 + lVar1;
  *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x101fa2;
  sVar11 = strlen(pcVar12);
  *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x101fb9;
  strncat(pcVar12,"iommu_group",0xfff - sVar11);
  __buf = acStack_2c10 + lVar1;
  *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x101fce;
  sVar10 = readlink(pcVar12,__buf,0x1000);
  uVar14 = SUB84(__buf,0);
  if (sVar10 == -1) {
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102160;
    vfio_init_cold_11();
LAB_00102160:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x10216a;
    vfio_init_cold_10();
LAB_0010216a:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102174;
    vfio_init_cold_8();
LAB_00102174:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x10217e;
    vfio_init_cold_7();
LAB_0010217e:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102188;
    vfio_init_cold_6();
LAB_00102188:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102192;
    vfio_init_cold_5();
LAB_00102192:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x10219c;
    vfio_init_cold_3();
LAB_0010219c:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x1021a6;
    vfio_init_cold_9();
LAB_001021a6:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x1021b0;
    vfio_init_cold_1();
LAB_001021b0:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x1021ba;
    vfio_init_cold_2();
  }
  else {
    acStack_2c10[(int)sVar10 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x101fef;
    pcVar12 = __xpg_basename(acStack_2c10 + lVar1);
    uVar14 = 0x1034ad;
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102005;
    iVar4 = __isoc99_sscanf(pcVar12,"%d",(long)&uStack_2eac + lVar1);
    if (iVar4 == -1) goto LAB_00102160;
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102015;
    iVar4 = get_vfio_container();
    *(int *)((long)&iStack_2eb0 + lVar1) = iVar4;
    if (iVar4 == -1) {
      uVar14 = 2;
      *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102032;
      iVar6 = open("/dev/vfio/vfio",2);
      if (iVar6 == -1) goto LAB_0010219c;
      *(int *)((long)&iStack_2eb0 + lVar1) = iVar6;
      *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102045;
      set_vfio_container(iVar6);
      uVar14 = 0x3b64;
      *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102054;
      iVar6 = ioctl(*(int *)((long)&iStack_2eb0 + lVar1),0x3b64);
      if (iVar6 != 0) goto LAB_001021a6;
      uVar14 = 0x3b65;
      *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102070;
      iVar6 = ioctl(*(int *)((long)&iStack_2eb0 + lVar1),0x3b65,1);
      if (iVar6 == 1) goto LAB_00102079;
      goto LAB_001021b0;
    }
LAB_00102079:
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x10209b;
    snprintf(acStack_1c10 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_2eac + lVar1)
            );
    uVar14 = 2;
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x1020aa;
    iVar6 = open(acStack_1c10 + lVar1,2);
    if (iVar6 == -1) goto LAB_0010216a;
    *(undefined8 *)((long)&uStack_2ea8 + lVar1) = 8;
    uVar14 = 0x3b67;
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x1020d0;
    iVar8 = ioctl(iVar6,0x3b67);
    if (iVar8 == -1) goto LAB_00102174;
    if ((auStack_2ea0[lVar1 + -4] & 1) == 0) goto LAB_0010217e;
    uVar14 = 0x3b68;
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x1020f6;
    iVar8 = ioctl(iVar6,0x3b68,(long)&iStack_2eb0 + lVar1);
    if (iVar8 == -1) goto LAB_00102188;
    if (iVar4 != -1) {
LAB_00102121:
      uVar14 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102133;
      iVar4 = ioctl(iVar6,0x3b6a,lVar19);
      if (iVar4 != -1) {
        *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102141;
        vfio_enable_dma(iVar4);
        return iVar4;
      }
      goto LAB_00102192;
    }
    uVar14 = 0x3b66;
    *(undefined8 *)((long)&lStack_2eb8 + lVar1) = 0x102118;
    iVar4 = ioctl(*(int *)((long)&iStack_2eb0 + lVar1),0x3b66,1);
    if (iVar4 != -1) goto LAB_00102121;
  }
  iVar4 = (int)auStack_2ea0 + (int)lVar1;
  *(code **)((long)&lStack_2eb8 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2eb8 + lVar1) = lVar19;
  *(undefined8 *)((long)auStack_30e0 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_30d0 + lVar1) = 0;
  *(undefined8 *)((long)asStack_30d0 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_30d0 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_30d0 + lVar1) = uVar14;
  *(undefined8 *)((long)auStack_30e0 + lVar1) = 0x1021ef;
  iVar6 = ioctl(iVar4,0x3b6c);
  if (iVar6 != -1) {
    sVar11 = *(size_t *)((long)asStack_30d0 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_30d0 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_30e0 + lVar1) = 0x102212;
    pvVar13 = mmap((void *)0x0,sVar11,3,1,iVar4,__offset);
    if (pvVar13 != (void *)0xffffffffffffffff) goto LAB_00102229;
    *(undefined8 *)((long)auStack_30e0 + lVar1) = 0x102222;
    vfio_map_region_cold_1();
  }
  pvVar13 = (void *)0xffffffffffffffff;
LAB_00102229:
  return (int)pvVar13;
}

Assistant:

int vfio_enable_msix(int device_fd, uint32_t interrupt_vector) {
	info("Enable MSIX Interrupts");
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];
	struct vfio_irq_set* irq_set;
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	if (!interrupt_vector) {
		interrupt_vector = 1;
	} else if (interrupt_vector > MAX_INTERRUPT_VECTORS)
		interrupt_vector = MAX_INTERRUPT_VECTORS + 1;

	irq_set->count = interrupt_vector;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	fd_ptr[0] = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSIX interrupt");

	return event_fd;
}